

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O2

QP2PassNodeResult __thiscall
mp::QP2PassVisitor::VisitAtmostAffine(QP2PassVisitor *this,Expr e,AffineExpr *ae)

{
  longdouble lVar1;
  int iVar2;
  AffineExpr *pAVar3;
  int iVar4;
  
  lVar1 = this->factor_;
  this->factor_ = (longdouble)1;
  pAVar3 = this->p_ae_;
  this->p_ae_ = ae;
  (ae->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (ae->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  ae->constant_term_ = 0.0;
  iVar2 = this->mode_;
  if (1 < iVar2) {
    this->mode_ = 1;
  }
  iVar4 = BasicExprVisitor<mp::QP2PassVisitor,_int,_mp::internal::ExprTypes>::Visit
                    ((BasicExprVisitor<mp::QP2PassVisitor,_int,_mp::internal::ExprTypes> *)this,e);
  this->mode_ = iVar2;
  this->p_ae_ = pAVar3;
  this->factor_ = lVar1;
  return iVar4;
}

Assistant:

QP2PassNodeResult QP2PassVisitor::VisitAtmostAffine(
    Expr e, AffineExpr& ae) {
  auto f_save = factor_;
  factor_ = 1.0;
  auto pae_save = p_ae_;
  p_ae_ = &ae;
  ae.clear();
  auto mode_save = mode_;
  if (mode_>1)                  // at most linear mode
    mode_ = 1;
  auto result = Visit(e);
  mode_ = mode_save;
  p_ae_ = pae_save;
  factor_ = f_save;
  return result;
}